

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O1

void __thiscall winmd::reader::table_base::set_data(table_base *this,byte_view *view)

{
  uint offset;
  
  if (this->m_row_count != 0) {
    this->m_data = view->m_first;
    offset = this->m_row_count * (uint)this->m_row_size;
    byte_view::check_available(view,offset);
    view->m_first = view->m_first + offset;
  }
  return;
}

Assistant:

void set_data(byte_view& view) noexcept
        {
            XLANG_ASSERT(!m_data);

            if (m_row_count)
            {
                XLANG_ASSERT(m_row_size);
                m_data = view.begin();
                view = view.seek(m_row_count * m_row_size);
            }
        }